

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O2

int debug_lock_unlock(uint mode,void *lock_)

{
  int iVar1;
  
  evthread_debug_lock_mark_unlocked(mode,(debug_lock *)lock_);
  if (original_lock_fns_.unlock != (_func_int_uint_void_ptr *)0x0) {
    iVar1 = (*original_lock_fns_.unlock)(mode,*(void **)((long)lock_ + 0x18));
    return iVar1;
  }
  return 0;
}

Assistant:

static int
debug_lock_unlock(unsigned mode, void *lock_)
{
	struct debug_lock *lock = lock_;
	int res = 0;
	evthread_debug_lock_mark_unlocked(mode, lock);
	if (original_lock_fns_.unlock)
		res = original_lock_fns_.unlock(mode, lock->lock);
	return res;
}